

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ab3c04::BacktraceData::BacktraceData(BacktraceData *this,string *topSource)

{
  string *topSource_local;
  BacktraceData *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)topSource);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map(&this->CommandMap);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::unordered_map(&this->FileMap);
  std::
  unordered_map<const_cmListFileContext_*,_unsigned_int,_std::hash<const_cmListFileContext_*>,_std::equal_to<const_cmListFileContext_*>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>_>
  ::unordered_map(&this->NodeMap);
  Json::Value::Value(&this->Commands,arrayValue);
  Json::Value::Value(&this->Files,arrayValue);
  Json::Value::Value(&this->Nodes,arrayValue);
  return;
}

Assistant:

BacktraceData::BacktraceData(std::string topSource)
  : TopSource(std::move(topSource))
{
}